

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encodings.hpp
# Opt level: O3

string * __thiscall
webfront::base64::detail::encode_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,uint8_t *input,size_t size)

{
  pointer pcVar1;
  char cVar2;
  char *pcVar3;
  uint8_t *puVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  puVar4 = (uint8_t *)0x0;
  http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
  _M_construct(__return_storage_ptr__,((long)input * 4 + 8U) / 3,'\0');
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if (input != (uint8_t *)0x2) {
    puVar4 = (uint8_t *)0x0;
    do {
      *pcVar3 = encode::code._M_elems[(byte)this[(long)puVar4] >> 2];
      pcVar3[1] = encode::code._M_elems
                  [(uint)((byte)(this + 1)[(long)puVar4] >> 4) | ((byte)this[(long)puVar4] & 3) << 4
                  ];
      pcVar3[2] = encode::code._M_elems
                  [(uint)((byte)(this + 2)[(long)puVar4] >> 6) +
                   ((byte)(this + 1)[(long)puVar4] & 0xf) * 4];
      pcVar3[3] = encode::code._M_elems[(byte)(this + 2)[(long)puVar4] & 0x3f];
      pcVar3 = pcVar3 + 4;
      puVar4 = puVar4 + 3;
    } while (puVar4 < input + -2);
  }
  if (puVar4 < input) {
    *pcVar3 = encode::code._M_elems[(byte)this[(long)puVar4] >> 2];
    if (puVar4 == input + -1) {
      pcVar3[1] = encode::code._M_elems[((byte)this[(long)puVar4] & 3) << 4];
      cVar2 = '=';
    }
    else {
      pcVar3[1] = encode::code._M_elems
                  [(byte)((char)this[(long)puVar4] << 4 | (byte)(this + 1)[(long)puVar4] >> 4) &
                   0x3f];
      cVar2 = encode::code._M_elems[(ulong)((byte)(this + 1)[(long)puVar4] & 0xf) * 4];
    }
    pcVar3[2] = cVar2;
    pcVar3[3] = '=';
    pcVar3 = pcVar3 + 4;
  }
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if (pcVar3 != pcVar1 + __return_storage_ptr__->_M_string_length) {
    http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
              (__return_storage_ptr__,(long)pcVar3 - (long)pcVar1,1);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]]inline std::string encode(const uint8_t* input, size_t size) {
    static constexpr std::array code = {'A', 'B', 'C', 'D', 'E', 'F', 'G', 'H', 'I', 'J', 'K', 'L', 'M', 'N', 'O', 'P', 'Q', 'R', 'S', 'T', 'U', 'V',
                                    'W', 'X', 'Y', 'Z', 'a', 'b', 'c', 'd', 'e', 'f', 'g', 'h', 'i', 'j', 'k', 'l', 'm', 'n', 'o', 'p', 'q', 'r',
                                    's', 't', 'u', 'v', 'w', 'x', 'y', 'z', '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', '+', '/'};

    std::string output((4 * (size + 2) / 3), '\0');
    auto coded = output.begin();
    size_t i = 0;
    for (; i < size - 2; i += 3) {
        *coded++ = code[(input[i] >> 2) & 0x3Fu];
        *coded++ = code[((input[i] & 0x3u) << 4) | ((input[i + 1] & 0xF0u) >> 4)];
        *coded++ = code[((input[i + 1] & 0xFu) << 2) | ((input[i + 2] & 0xC0u) >> 6)];
        *coded++ = code[input[i + 2] & 0x3Fu];
    }
    if (i < size) {
        *coded++ = code[static_cast<size_t>(input[i] >> 2) & 0x3Fu];
        if (i == (size - 1)) {
            *coded++ = code[static_cast<size_t>(input[i] & 0x3u) << 4];
            *coded++ = '=';
        }
        else {
            *coded++ = code[static_cast<size_t>((input[i] & 0x3u) << 4 | ((input[i + 1] & 0xF0u) >> 4)) & 0x3Fu];
            *coded++ = code[static_cast<size_t>((input[i + 1] & 0xFu) << 2) & 0x3Fu];
        }
        *coded++ = '=';
    }
    if (coded != output.end()) output.erase(coded);

    return output;
}